

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_setter_argument,bool force_present,
          bool singular_if_not_packed,BytesMode bytes_mode,bool force_singular)

{
  bool bVar1;
  bool bVar2;
  Type TVar3;
  CppType CVar4;
  char *pcVar5;
  undefined3 in_register_00000081;
  undefined3 in_stack_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  JSTypeName_abi_cxx11_
            (__return_storage_ptr__,this,options,(FieldDescriptor *)(ulong)_singular_if_not_packed,
             CONCAT31(in_register_00000081,is_setter_argument));
  if ((((undefined1)bytes_mode == BYTES_DEFAULT) &&
      (*(int *)((long)&(options->namespace_prefix).field_2 + 0xc) == 3)) &&
     (bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)options), bVar1 || !force_present)) {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)options);
    if (_singular_if_not_packed == 0 && TVar3 == TYPE_BYTES) {
      pcVar5 = "(Array<!Uint8Array>|Array<string>)";
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      this = (_anonymous_namespace_ *)pcVar5;
    }
    else {
      bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
      if (!bVar1) {
        std::operator+(&local_70,"!",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::operator+(&local_50,"Array<",__return_storage_ptr__);
      std::operator+(&local_70,&local_50,">");
      this = (_anonymous_namespace_ *)&local_70;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((char)field == '\0') {
    if ((((!is_setter_argument) && (*(int *)((long)&(options->namespace_prefix).field_2 + 0xc) != 2)
         ) && ((TVar3 = FieldDescriptor::type((FieldDescriptor *)options), TVar3 != TYPE_ENUM &&
               ((*(int *)((options->namespace_prefix)._M_string_length + 0x3c) != 3 ||
                (CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)options),
                CVar4 == CPPTYPE_MESSAGE)))))) &&
       (bVar1 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this), bVar1)) {
      std::operator+(&local_70,"?",__return_storage_ptr__);
      goto LAB_0028b3f3;
    }
  }
  else {
    bVar1 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
    if (bVar1) {
      std::operator+(&local_70,"?",__return_storage_ptr__);
      this = (_anonymous_namespace_ *)&local_70;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    bVar2 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
    if (bVar2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::operator+(&local_70,"!",__return_storage_ptr__);
LAB_0028b3f3:
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string JSFieldTypeAnnotation(const GeneratorOptions& options,
                                  const FieldDescriptor* field,
                                  bool is_setter_argument, bool force_present,
                                  bool singular_if_not_packed,
                                  BytesMode bytes_mode = BYTES_DEFAULT,
                                  bool force_singular = false) {
  std::string jstype = JSTypeName(options, field, bytes_mode);

  if (!force_singular && field->is_repeated() &&
      (field->is_packed() || !singular_if_not_packed)) {
    if (field->type() == FieldDescriptor::TYPE_BYTES &&
        bytes_mode == BYTES_DEFAULT) {
      jstype = "(Array<!Uint8Array>|Array<string>)";
    } else {
      if (!IsPrimitive(jstype)) {
        jstype = "!" + jstype;
      }
      jstype = "Array<" + jstype + ">";
    }
  }

  bool is_null_or_undefined = false;

  if (is_setter_argument) {
    if (SetterAcceptsNull(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }

    if (SetterAcceptsUndefined(options, field)) {
      jstype += "|undefined";
      is_null_or_undefined = true;
    }
  } else if (force_present) {
    // Don't add null or undefined.
  } else {
    if (DeclaredReturnTypeIsNullable(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }
  }

  if (!is_null_or_undefined && !IsPrimitive(jstype)) {
    jstype = "!" + jstype;
  }

  return jstype;
}